

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_dependent_filter.cpp
# Opt level: O1

void duckdb::ExtractConjunctedExpressions
               (Expression *expression,
               unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               *expressions)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  int iVar5;
  BoundConjunctionExpression *pBVar6;
  type expression_00;
  mapped_type *pmVar7;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  table_idxs;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  if ((expression->super_BaseExpression).type == CONJUNCTION_AND) {
    pBVar6 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                       (&expression->super_BaseExpression);
    puVar1 = (pBVar6->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (pBVar6->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
      expression_00 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this);
      ExtractConjunctedExpressions(expression_00,expressions);
    }
  }
  else {
    iVar5 = (*(expression->super_BaseExpression)._vptr_BaseExpression[0xc])(expression);
    if ((char)iVar5 == '\0') {
      local_58._M_buckets = &local_58._M_single_bucket;
      local_58._M_bucket_count = 1;
      local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_58._M_element_count = 0;
      local_58._M_rehash_policy._M_max_load_factor = 1.0;
      local_58._M_rehash_policy._M_next_resize = 0;
      local_58._M_single_bucket = (__node_base_ptr)0x0;
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = &local_58;
      pcStack_60 = ::std::
                   _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/rule/join_dependent_filter.cpp:20:52)>
                   ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/rule/join_dependent_filter.cpp:20:52)>
                 ::_M_manager;
      ExpressionIterator::EnumerateChildren
                (expression,(function<void_(const_duckdb::Expression_&)> *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_58._M_element_count == 1) {
        pmVar7 = ::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)expressions,(key_type *)(local_58._M_before_begin._M_nxt + 1));
        _Var2._M_head_impl =
             (pmVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        if (_Var2._M_head_impl == (Expression *)0x0) {
          (*(expression->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_90,expression);
        }
        else {
          (*(expression->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_88,expression);
          pBVar6 = (BoundConjunctionExpression *)operator_new(0x70);
          local_78._M_unused._M_object =
               (pmVar7->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pmVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          local_80._M_head_impl = local_88._M_head_impl;
          local_88._M_head_impl = (Expression *)0x0;
          BoundConjunctionExpression::BoundConjunctionExpression
                    (pBVar6,CONJUNCTION_AND,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_78,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_80);
          if (local_80._M_head_impl != (Expression *)0x0) {
            (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_80._M_head_impl = (Expression *)0x0;
          local_90._M_head_impl = (Expression *)pBVar6;
          if ((Expression *)local_78._M_unused._0_8_ != (Expression *)0x0) {
            (**(code **)(*local_78._M_unused._M_object + 8))();
          }
        }
        _Var4._M_head_impl = local_90._M_head_impl;
        local_90._M_head_impl = (Expression *)0x0;
        _Var3._M_head_impl =
             (pmVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pmVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
        if (_Var3._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
        }
        if (local_90._M_head_impl != (Expression *)0x0) {
          (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_90._M_head_impl = (Expression *)0x0;
        if ((_Var2._M_head_impl != (Expression *)0x0) &&
           (local_88._M_head_impl != (Expression *)0x0)) {
          (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_58);
    }
  }
  return;
}

Assistant:

static inline void ExtractConjunctedExpressions(Expression &expression,
                                                unordered_map<idx_t, unique_ptr<Expression>> &expressions) {
	if (expression.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		auto &conjunction = expression.Cast<BoundConjunctionExpression>();
		for (auto &child : conjunction.children) {
			ExtractConjunctedExpressions(*child, expressions);
		}
	} else if (!expression.IsVolatile()) {
		unordered_set<idx_t> table_idxs;
		GetTableIndices(expression, table_idxs);
		if (table_idxs.size() != 1) {
			return; // Needs to reference exactly one table
		}

		// If there was already an expression, AND it together
		auto &table_expressions = expressions[*table_idxs.begin()];
		table_expressions = table_expressions
		                        ? make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND,
		                                                                std::move(table_expressions), expression.Copy())
		                        : expression.Copy();
	}
}